

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O1

void rlVertex3f(float x,float y,float z)

{
  int *piVar1;
  rlDrawCall *prVar2;
  long lVar3;
  int iVar4;
  float tx;
  float ty;
  float tz;
  float fVar5;
  float fVar6;
  
  fVar6 = x;
  fVar5 = y;
  if (RLGL.State.transformRequired) {
    fVar6 = RLGL.State.transform.m8 * z + RLGL.State.transform.m0 * x + RLGL.State.transform.m4 * y
            + RLGL.State.transform.m12;
    fVar5 = RLGL.State.transform.m9 * z + RLGL.State.transform.m1 * x + RLGL.State.transform.m5 * y
            + RLGL.State.transform.m13;
    z = z * RLGL.State.transform.m10 + x * RLGL.State.transform.m2 + y * RLGL.State.transform.m6 +
        RLGL.State.transform.m14;
  }
  if ((RLGL.currentBatch)->vertexBuffer[(RLGL.currentBatch)->currentBuffer].elementCount * 4 + -4 <
      RLGL.State.vertexCounter) {
    prVar2 = (RLGL.currentBatch)->draws;
    lVar3 = (long)(RLGL.currentBatch)->drawCounter;
    iVar4 = prVar2[lVar3 + -1].mode;
    if (iVar4 == 7) {
      if ((prVar2[lVar3 + -1].vertexCount & 3) != 0) goto LAB_0015f543;
      iVar4 = 5;
    }
    else if (iVar4 == 4) {
      if (0x55555554 < prVar2[lVar3 + -1].vertexCount * -0x55555555 + 0x2aaaaaaaU)
      goto LAB_0015f543;
      iVar4 = 4;
    }
    else if ((iVar4 != 1) || (iVar4 = 3, (prVar2[lVar3 + -1].vertexCount & 1) != 0))
    goto LAB_0015f543;
    rlCheckRenderBatchLimit(iVar4);
  }
LAB_0015f543:
  (RLGL.currentBatch)->vertexBuffer[(RLGL.currentBatch)->currentBuffer].vertices
  [(long)RLGL.State.vertexCounter * 3] = fVar6;
  (RLGL.currentBatch)->vertexBuffer[(RLGL.currentBatch)->currentBuffer].vertices
  [(long)RLGL.State.vertexCounter * 3 + 1] = fVar5;
  (RLGL.currentBatch)->vertexBuffer[(RLGL.currentBatch)->currentBuffer].vertices
  [(long)RLGL.State.vertexCounter * 3 + 2] = z;
  (RLGL.currentBatch)->vertexBuffer[(RLGL.currentBatch)->currentBuffer].texcoords
  [(long)RLGL.State.vertexCounter * 2] = RLGL.State.texcoordx;
  (RLGL.currentBatch)->vertexBuffer[(RLGL.currentBatch)->currentBuffer].texcoords
  [(long)RLGL.State.vertexCounter * 2 + 1] = RLGL.State.texcoordy;
  (RLGL.currentBatch)->vertexBuffer[(RLGL.currentBatch)->currentBuffer].normals
  [(long)RLGL.State.vertexCounter * 3] = RLGL.State.normalx;
  (RLGL.currentBatch)->vertexBuffer[(RLGL.currentBatch)->currentBuffer].normals
  [(long)RLGL.State.vertexCounter * 3 + 1] = RLGL.State.normaly;
  (RLGL.currentBatch)->vertexBuffer[(RLGL.currentBatch)->currentBuffer].normals
  [(long)RLGL.State.vertexCounter * 3 + 2] = RLGL.State.normalz;
  (RLGL.currentBatch)->vertexBuffer[(RLGL.currentBatch)->currentBuffer].colors
  [(long)RLGL.State.vertexCounter * 4] = RLGL.State.colorr;
  (RLGL.currentBatch)->vertexBuffer[(RLGL.currentBatch)->currentBuffer].colors
  [(long)RLGL.State.vertexCounter * 4 + 1] = RLGL.State.colorg;
  (RLGL.currentBatch)->vertexBuffer[(RLGL.currentBatch)->currentBuffer].colors
  [(long)RLGL.State.vertexCounter * 4 + 2] = RLGL.State.colorb;
  (RLGL.currentBatch)->vertexBuffer[(RLGL.currentBatch)->currentBuffer].colors
  [(long)RLGL.State.vertexCounter * 4 + 3] = RLGL.State.colora;
  RLGL.State.vertexCounter = RLGL.State.vertexCounter + 1;
  piVar1 = &(RLGL.currentBatch)->draws[(long)(RLGL.currentBatch)->drawCounter + -1].vertexCount;
  *piVar1 = *piVar1 + 1;
  return;
}

Assistant:

void rlVertex3f(float x, float y, float z)
{
    float tx = x;
    float ty = y;
    float tz = z;

    // Transform provided vector if required
    if (RLGL.State.transformRequired)
    {
        tx = RLGL.State.transform.m0*x + RLGL.State.transform.m4*y + RLGL.State.transform.m8*z + RLGL.State.transform.m12;
        ty = RLGL.State.transform.m1*x + RLGL.State.transform.m5*y + RLGL.State.transform.m9*z + RLGL.State.transform.m13;
        tz = RLGL.State.transform.m2*x + RLGL.State.transform.m6*y + RLGL.State.transform.m10*z + RLGL.State.transform.m14;
    }

    // WARNING: We can't break primitives when launching a new batch
    // RL_LINES comes in pairs, RL_TRIANGLES come in groups of 3 vertices and RL_QUADS come in groups of 4 vertices
    // We must check current draw.mode when a new vertex is required and finish the batch only if the draw.mode draw.vertexCount is %2, %3 or %4
    if (RLGL.State.vertexCounter > (RLGL.currentBatch->vertexBuffer[RLGL.currentBatch->currentBuffer].elementCount*4 - 4))
    {
        if ((RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].mode == RL_LINES) &&
            (RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].vertexCount%2 == 0))
        {
            // Reached the maximum number of vertices for RL_LINES drawing
            // Launch a draw call but keep current state for next vertices comming
            // NOTE: We add +1 vertex to the check for security
            rlCheckRenderBatchLimit(2 + 1);
        }
        else if ((RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].mode == RL_TRIANGLES) &&
            (RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].vertexCount%3 == 0))
        {
            rlCheckRenderBatchLimit(3 + 1);
        }
        else if ((RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].mode == RL_QUADS) &&
            (RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].vertexCount%4 == 0))
        {
            rlCheckRenderBatchLimit(4 + 1);
        }
    }

    // Add vertices
    RLGL.currentBatch->vertexBuffer[RLGL.currentBatch->currentBuffer].vertices[3*RLGL.State.vertexCounter] = tx;
    RLGL.currentBatch->vertexBuffer[RLGL.currentBatch->currentBuffer].vertices[3*RLGL.State.vertexCounter + 1] = ty;
    RLGL.currentBatch->vertexBuffer[RLGL.currentBatch->currentBuffer].vertices[3*RLGL.State.vertexCounter + 2] = tz;

    // Add current texcoord
    RLGL.currentBatch->vertexBuffer[RLGL.currentBatch->currentBuffer].texcoords[2*RLGL.State.vertexCounter] = RLGL.State.texcoordx;
    RLGL.currentBatch->vertexBuffer[RLGL.currentBatch->currentBuffer].texcoords[2*RLGL.State.vertexCounter + 1] = RLGL.State.texcoordy;

    // Add current normal
    RLGL.currentBatch->vertexBuffer[RLGL.currentBatch->currentBuffer].normals[3*RLGL.State.vertexCounter] = RLGL.State.normalx;
    RLGL.currentBatch->vertexBuffer[RLGL.currentBatch->currentBuffer].normals[3*RLGL.State.vertexCounter + 1] = RLGL.State.normaly;
    RLGL.currentBatch->vertexBuffer[RLGL.currentBatch->currentBuffer].normals[3*RLGL.State.vertexCounter + 2] = RLGL.State.normalz;

    // Add current color
    RLGL.currentBatch->vertexBuffer[RLGL.currentBatch->currentBuffer].colors[4*RLGL.State.vertexCounter] = RLGL.State.colorr;
    RLGL.currentBatch->vertexBuffer[RLGL.currentBatch->currentBuffer].colors[4*RLGL.State.vertexCounter + 1] = RLGL.State.colorg;
    RLGL.currentBatch->vertexBuffer[RLGL.currentBatch->currentBuffer].colors[4*RLGL.State.vertexCounter + 2] = RLGL.State.colorb;
    RLGL.currentBatch->vertexBuffer[RLGL.currentBatch->currentBuffer].colors[4*RLGL.State.vertexCounter + 3] = RLGL.State.colora;

    RLGL.State.vertexCounter++;
    RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].vertexCount++;
}